

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaInvPnd.cpp
# Opt level: O3

void __thiscall NaInvPend::Function(NaInvPend *this,NaReal *u,NaReal *y)

{
  double dVar1;
  NaReal (*paNVar2) [4];
  int i;
  long lVar3;
  int j;
  long lVar4;
  NaReal local_28 [5];
  
  local_28[0] = this->x[0];
  local_28[1] = this->x[1];
  local_28[2] = this->q[0];
  local_28[3] = this->q[1];
  paNVar2 = this->A;
  lVar3 = 0;
  do {
    dVar1 = *u * this->B[lVar3];
    y[lVar3] = dVar1;
    lVar4 = 0;
    do {
      dVar1 = dVar1 + (*paNVar2)[lVar4] * local_28[lVar4];
      y[lVar3] = dVar1;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
    lVar3 = lVar3 + 1;
    paNVar2 = paNVar2 + 1;
  } while (lVar3 != 4);
  this->x[0] = *y;
  this->x[1] = y[1];
  this->q[0] = y[2];
  this->q[1] = y[3];
  return;
}

Assistant:

void
NaInvPend::Function (NaReal* u, NaReal* y)
{
  NaReal	yp[4];	/* previous state */

  yp[0] = x[0];
  yp[1] = x[1];
  yp[2] = q[0];
  yp[3] = q[1];

  for(int i = 0; i < 4; ++i)
    {
      y[i] = u[0] * B[i];
      for(int j = 0; j < 4; ++j)
	{
	  y[i] += A[i][j] * yp[j];
	}
    }

  x[0] = y[0];
  x[1] = y[1];
  q[0] = y[2];
  q[1] = y[3];
}